

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::MakefileColorEcho(int color,char *message,bool newline,bool enabled)

{
  char *pcVar1;
  uint local_20;
  int assumeTTY;
  bool enabled_local;
  bool newline_local;
  char *message_local;
  int color_local;
  
  local_20 = 0x400;
  pcVar1 = cmsys::SystemTools::GetEnv("DART_TEST_FROM_DART");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = cmsys::SystemTools::GetEnv("DASHBOARD_TEST_FROM_CTEST");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = cmsys::SystemTools::GetEnv("CTEST_INTERACTIVE_DEBUG_MODE");
      if (pcVar1 == (char *)0x0) goto LAB_00457922;
    }
  }
  local_20 = 0;
LAB_00457922:
  if (enabled) {
    cmsysTerminal_cfprintf(color | local_20,(FILE *)_stdout,"%s",message);
  }
  else {
    fprintf(_stdout,"%s",message);
  }
  if (newline) {
    fprintf(_stdout,"\n");
  }
  return;
}

Assistant:

void cmSystemTools::MakefileColorEcho(int color, const char* message,
                                      bool newline, bool enabled)
{
  // On some platforms (an MSYS prompt) cmsysTerminal may not be able
  // to determine whether the stream is displayed on a tty.  In this
  // case it assumes no unless we tell it otherwise.  Since we want
  // color messages to be displayed for users we will assume yes.
  // However, we can test for some situations when the answer is most
  // likely no.
  int assumeTTY = cmsysTerminal_Color_AssumeTTY;
  if(cmSystemTools::GetEnv("DART_TEST_FROM_DART") ||
     cmSystemTools::GetEnv("DASHBOARD_TEST_FROM_CTEST") ||
     cmSystemTools::GetEnv("CTEST_INTERACTIVE_DEBUG_MODE"))
    {
    // Avoid printing color escapes during dashboard builds.
    assumeTTY = 0;
    }

  if(enabled)
    {
    // Print with color.  Delay the newline until later so that
    // all color restore sequences appear before it.
    cmsysTerminal_cfprintf(color | assumeTTY, stdout, "%s", message);
    }
  else
    {
    // Color is disabled.  Print without color.
    fprintf(stdout, "%s", message);
    }

  if(newline)
    {
    fprintf(stdout, "\n");
    }
}